

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprVariableDefinition *
CreateFunctionContextArgument(ExpressionContext *ctx,SynBase *source,FunctionData *function)

{
  uint uniqueId;
  TypeBase *pTVar1;
  uint offset;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExprVariableDefinition *pEVar5;
  VariableHandle *pVVar6;
  char *pcVar7;
  bool bVar8;
  InplaceStr name;
  VariableData *pVVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  pTVar1 = function->contextType;
  if (pTVar1->isGeneric != true) {
    offset = anon_unknown.dwarf_94284::AllocateArgumentInScope(ctx,source,0,pTVar1);
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x50);
    bVar8 = function->scope->ownerType == (TypeBase *)0x0;
    pcVar7 = "this";
    if (bVar8) {
      pcVar7 = "$context";
    }
    name.end = pcVar7 + (ulong)bVar8 * 4 + 4;
    name.begin = pcVar7;
    SynIdentifier::SynIdentifier((SynIdentifier *)CONCAT44(extraout_var,iVar2),name);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
    pVVar4 = (VariableData *)CONCAT44(extraout_var_00,iVar3);
    uniqueId = ctx->uniqueVariableId;
    ctx->uniqueVariableId = uniqueId + 1;
    VariableData::VariableData
              (pVVar4,ctx->allocator,source,ctx->scope,0,pTVar1,
               (SynIdentifier *)CONCAT44(extraout_var,iVar2),offset,uniqueId);
    function->contextArgument = pVVar4;
    ExpressionContext::AddVariable(ctx,pVVar4,true);
    if (0xffff < function->functionScope->dataSize) {
      anon_unknown.dwarf_94284::Report
                (ctx,source,"ERROR: function argument size cannot exceed 65536");
    }
    if (0xffff < function->type->returnType->size) {
      anon_unknown.dwarf_94284::Report(ctx,source,"ERROR: function return size cannot exceed 65536")
      ;
    }
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar5 = (ExprVariableDefinition *)CONCAT44(extraout_var_01,iVar2);
    pTVar1 = ctx->typeVoid;
    iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pVVar6 = (VariableHandle *)CONCAT44(extraout_var_02,iVar2);
    pVVar4 = function->contextArgument;
    pVVar6->source = (SynBase *)0x0;
    pVVar6->variable = pVVar4;
    pVVar6->next = (VariableHandle *)0x0;
    pVVar6->listed = false;
    (pEVar5->super_ExprBase).typeID = 0x1e;
    (pEVar5->super_ExprBase).source = source;
    (pEVar5->super_ExprBase).type = pTVar1;
    (pEVar5->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar5->super_ExprBase).listed = false;
    (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a58;
    pEVar5->variable = pVVar6;
    pEVar5->initializer = (ExprBase *)0x0;
    return pEVar5;
  }
  __assert_fail("!type->isGeneric",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x21c9,
                "ExprVariableDefinition *CreateFunctionContextArgument(ExpressionContext &, SynBase *, FunctionData *)"
               );
}

Assistant:

ExprVariableDefinition* CreateFunctionContextArgument(ExpressionContext &ctx, SynBase *source, FunctionData *function)
{
	TypeBase *type = function->contextType;

	assert(!type->isGeneric);

	unsigned offset = AllocateArgumentInScope(ctx, source, 0, type);

	SynIdentifier *nameIdentifier = new (ctx.get<SynIdentifier>()) SynIdentifier(InplaceStr(function->scope->ownerType ? "this" : "$context"));

	function->contextArgument = new (ctx.get<VariableData>()) VariableData(ctx.allocator, source, ctx.scope, 0, type, nameIdentifier, offset, ctx.uniqueVariableId++);

	ctx.AddVariable(function->contextArgument, true);

	if(function->functionScope->dataSize >= 65536)
		Report(ctx, source, "ERROR: function argument size cannot exceed 65536");

	if(function->type->returnType->size >= 65536)
		Report(ctx, source, "ERROR: function return size cannot exceed 65536");

	return new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(source, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, function->contextArgument), NULL);
}